

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O2

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::EnsurePreReservedRegion
          (PreReservedVirtualAllocWrapper *this)

{
  LPVOID pvVar1;
  AutoCriticalSection local_20;
  AutoCriticalSection autocs;
  
  pvVar1 = this->preReservedStartAddress;
  if (pvVar1 == (LPVOID)0x0) {
    local_20.cs = &this->cs;
    CCLock::Enter(&(local_20.cs)->super_CCLock);
    pvVar1 = EnsurePreReservedRegionInternal(this);
    AutoCriticalSection::~AutoCriticalSection(&local_20);
  }
  return pvVar1;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::EnsurePreReservedRegion()
{
    LPVOID startAddress = preReservedStartAddress;
    if (startAddress != nullptr)
    {
        return startAddress;
    }

    {
        AutoCriticalSection autocs(&this->cs);
        return EnsurePreReservedRegionInternal();
    }
}